

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O3

void __thiscall
gss::innards::HomomorphismModel::HomomorphismModel
          (HomomorphismModel *this,InputGraph *target,InputGraph *pattern,HomomorphismParams *params
          ,shared_ptr<gss::innards::Proof> *proof)

{
  pointer *pppVar1;
  ulong *puVar2;
  pair<unsigned_int,_unsigned_int> *ppVar3;
  iterator iVar4;
  long *******ppppppplVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var13;
  long lVar14;
  iterator iVar15;
  long *plVar16;
  _List_node_base *p_Var17;
  size_type sVar18;
  UnsupportedConfiguration *pUVar19;
  code *pcVar20;
  HomomorphismParams *pHVar21;
  int v;
  int iVar22;
  size_type sVar23;
  uint j;
  uint uVar24;
  long *******ppppppplVar25;
  ulong uVar26;
  ulong uVar27;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar28;
  string_view sVar29;
  string_view s;
  string_view s_00;
  string_view s_01;
  int next_vertex_label;
  int next_edge_label;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> cannot_order_yet;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  pattern_less_thans_in_wrong_order;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  vertex_labels_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  edge_labels_map;
  int local_170;
  int local_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [112];
  uint local_e8;
  long *******local_e0;
  long *******local_d8;
  long local_d0;
  HomomorphismParams *local_c8;
  string local_c0;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_a0;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  _Var13._M_head_impl = (Imp *)operator_new(0x2e8);
  Imp::Imp(_Var13._M_head_impl,params,proof);
  (this->_imp)._M_t.
  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ._M_t.
  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl =
       _Var13._M_head_impl;
  bVar7 = supports_exact_path_graphs(params);
  iVar22 = params->number_of_exact_path_graphs;
  bVar8 = supports_distance2_graphs(params);
  bVar9 = supports_distance3_graphs(params);
  bVar10 = supports_k4_graphs(params);
  iVar12 = 1;
  if (bVar7) {
    iVar12 = iVar22 + 1;
  }
  this->max_graphs =
       (uint)bVar10 + (uint)bVar9 + (uint)bVar8 + iVar12 +
       (int)(params->extra_shapes).
            super__List_base<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
            ._M_impl._M_node._M_size;
  uVar11 = InputGraph::size(pattern);
  this->pattern_size = uVar11;
  uVar11 = InputGraph::size(target);
  this->target_size = uVar11;
  (this->pattern_less_thans_in_convenient_order).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_less_thans_in_convenient_order).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pattern_less_thans_in_convenient_order).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->target_occur_less_thans_in_convenient_order).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_less_thans_in_convenient_order).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->target_occur_less_thans_in_convenient_order).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->target_occur_less_thans_in_convenient_order).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->target_occur_less_thans_in_convenient_order).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var13._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if (*(char *)((long)(_Var13._M_head_impl)->params + 0x88) == '\x01') {
    uVar11 = 1;
    if (*(char *)((long)(_Var13._M_head_impl)->params + 0x89) != '\0') {
      uVar11 = this->max_graphs;
    }
    (_Var13._M_head_impl)->max_graphs_for_clique_size_constraints = uVar11;
  }
  local_98 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&this->pattern_less_thans_in_convenient_order;
  local_a0 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&this->target_occur_less_thans_in_convenient_order;
  local_c8 = params;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&(_Var13._M_head_impl)->patterns_degrees,(ulong)this->max_graphs);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
            targets_degrees,(ulong)this->max_graphs);
  if (8 < this->max_graphs) {
    pUVar19 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
    local_168._0_8_ = local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Supplemental graphs won\'t fit in the chosen bitset size","");
    UnsupportedConfiguration::UnsupportedConfiguration(pUVar19,(string *)local_168);
    __cxa_throw(pUVar19,&UnsupportedConfiguration::typeinfo,
                UnsupportedConfiguration::~UnsupportedConfiguration);
  }
  if (*(long *)&(((this->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl
                 )->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0)
  {
    for (iVar22 = 0; iVar12 = InputGraph::size(pattern), iVar22 < iVar12; iVar22 = iVar22 + 1) {
      _Var13._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      InputGraph::vertex_name_abi_cxx11_((string *)local_168,pattern,iVar22);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(_Var13._M_head_impl)->pattern_vertex_proof_names,(string *)local_168);
      if ((undefined1 *)local_168._0_8_ != local_158) {
        operator_delete((void *)local_168._0_8_,local_158._0_8_ + 1);
      }
    }
    for (iVar22 = 0; iVar12 = InputGraph::size(target), iVar22 < iVar12; iVar22 = iVar22 + 1) {
      _Var13._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      InputGraph::vertex_name_abi_cxx11_((string *)local_168,target,iVar22);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(_Var13._M_head_impl)->target_vertex_proof_names,(string *)local_168);
      if ((undefined1 *)local_168._0_8_ != local_158) {
        operator_delete((void *)local_168._0_8_,local_158._0_8_ + 1);
      }
    }
  }
  bVar7 = InputGraph::directed(pattern);
  _Var13._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if (bVar7) {
    (_Var13._M_head_impl)->directed = true;
  }
  uVar11 = this->max_graphs;
  uVar24 = this->pattern_size;
  SVOBitset::SVOBitset((SVOBitset *)local_168,uVar24,0);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
            (&(_Var13._M_head_impl)->pattern_graph_rows,(ulong)(uVar11 * uVar24),
             (value_type *)local_168);
  if ((0x10 < local_e8) && ((pointer)local_168._0_8_ != (pointer)0x0)) {
    operator_delete__((void *)local_168._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
              pattern_loops,(ulong)this->pattern_size);
  if (this->pattern_size != 0) {
    uVar11 = 1;
    uVar26 = 0;
    do {
      bVar7 = uVar11 != 0;
      uVar11 = 0;
      if (bVar7) {
        uVar27 = 0;
        do {
          iVar22 = (int)uVar27;
          bVar7 = InputGraph::adjacent(pattern,(int)uVar26,iVar22);
          if (bVar7) {
            _Var13._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
            if (uVar26 == uVar27) {
              *(undefined4 *)
               (*(long *)&((_Var13._M_head_impl)->pattern_loops).
                          super__Vector_base<int,_std::allocator<int>_> + uVar26 * 4) = 1;
            }
            else {
              lVar14 = *(long *)&((_Var13._M_head_impl)->pattern_graph_rows).
                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
              ;
              lVar6 = (ulong)(this->max_graphs * (int)uVar26) * 0x88;
              if (*(uint *)(lVar14 + 0x80 + lVar6) < 0x11) {
                lVar14 = lVar14 + lVar6;
              }
              else {
                lVar14 = *(long *)(lVar14 + lVar6);
              }
              iVar12 = iVar22 + 0x3f;
              if (-1 < iVar22) {
                iVar12 = iVar22;
              }
              puVar2 = (ulong *)(lVar14 + (long)(iVar12 >> 6) * 8);
              *puVar2 = *puVar2 | 1L << (uVar27 & 0x3f);
            }
          }
          uVar11 = this->pattern_size;
          uVar27 = uVar27 + 1;
        } while ((uint)uVar27 < uVar11);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < uVar11);
  }
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_170 = 1;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar7 = InputGraph::has_vertex_labels(pattern);
  if (bVar7) {
    uVar11 = 0;
    if (this->pattern_size == 0) {
      sVar23 = 0;
    }
    else {
      do {
        local_168 = (undefined1  [16])InputGraph::vertex_label(pattern,uVar11);
        pVar28 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,int&>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                             *)&local_90,
                            (basic_string_view<char,_std::char_traits<char>_> *)local_168,&local_170
                           );
        if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_170 = local_170 + 1;
        }
        sVar23 = (size_type)this->pattern_size;
        uVar11 = uVar11 + 1;
      } while (uVar11 < this->pattern_size);
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
                ->pattern_vertex_labels,sVar23);
    if (this->pattern_size != 0) {
      uVar26 = 0;
      do {
        sVar29 = InputGraph::vertex_label(pattern,(int)uVar26);
        local_168._0_8_ = local_158;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,sVar29._M_str,sVar29._M_str + sVar29._M_len);
        iVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&local_90,(key_type *)local_168);
        *(_Rb_tree_color *)
         (*(long *)&(((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->pattern_vertex_labels).
                    super__Vector_base<int,_std::allocator<int>_> + uVar26 * 4) =
             iVar15._M_node[2]._M_color;
        if ((undefined1 *)local_168._0_8_ != local_158) {
          operator_delete((void *)local_168._0_8_,local_158._0_8_ + 1);
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 < this->pattern_size);
    }
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_16c = 1;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar7 = InputGraph::has_edge_labels(pattern);
  if ((bVar7) &&
     (std::vector<int,_std::allocator<int>_>::resize
                (&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                  _M_head_impl)->pattern_edge_labels,
                 (ulong)(this->pattern_size * this->pattern_size)), this->pattern_size != 0)) {
    uVar11 = 0;
    do {
      uVar24 = 0;
      do {
        bVar7 = InputGraph::adjacent(pattern,uVar11,uVar24);
        if (bVar7) {
          local_168 = (undefined1  [16])InputGraph::edge_label(pattern,uVar11,uVar24);
          pVar28 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                   ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,int&>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                               *)&local_60,
                              (basic_string_view<char,_std::char_traits<char>_> *)local_168,
                              &local_16c);
          if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_16c = local_16c + 1;
          }
          *(_Rb_tree_color *)
           (*(long *)&(((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->pattern_edge_labels).
                      super__Vector_base<int,_std::allocator<int>_> +
           (ulong)(this->pattern_size * uVar11 + uVar24) * 4) =
               pVar28.first._M_node._M_node[2]._M_color;
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 < this->pattern_size);
      uVar11 = uVar11 + 1;
    } while (uVar11 < this->pattern_size);
  }
  _Var13._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  uVar11 = this->target_size;
  uVar24 = this->max_graphs;
  SVOBitset::SVOBitset((SVOBitset *)local_168,uVar11,0);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
            (&(_Var13._M_head_impl)->target_graph_rows,(ulong)(uVar24 * uVar11),
             (value_type *)local_168);
  if ((0x10 < local_e8) && ((pointer)local_168._0_8_ != (pointer)0x0)) {
    operator_delete__((void *)local_168._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
              target_loops,(ulong)this->target_size);
  pcVar20 = std::
            _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:221:26)>
            ::_M_manager;
  local_168._8_8_ = 0;
  local_168._0_8_ = this;
  local_158._8_8_ =
       std::
       _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:221:26)>
       ::_M_invoke;
  local_158._0_8_ =
       std::
       _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:221:26)>
       ::_M_manager;
  InputGraph::for_each_edge
            (target,(function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
                     *)local_168);
  if ((code *)local_158._0_8_ != (code *)0x0) {
    (*(code *)local_158._0_8_)(local_168,local_168,3);
  }
  bVar7 = InputGraph::directed(pattern);
  if (bVar7) {
    _Var13._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    uVar11 = this->target_size;
    SVOBitset::SVOBitset((SVOBitset *)local_168,uVar11,0);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
              (&(_Var13._M_head_impl)->forward_target_graph_rows,(ulong)uVar11,
               (value_type *)local_168);
    if ((0x10 < local_e8) && ((pointer)local_168._0_8_ != (pointer)0x0)) {
      operator_delete__((void *)local_168._0_8_);
    }
    _Var13._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    uVar11 = this->target_size;
    SVOBitset::SVOBitset((SVOBitset *)local_168,uVar11,0);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
              (&(_Var13._M_head_impl)->reverse_target_graph_rows,(ulong)uVar11,
               (value_type *)local_168);
    if ((0x10 < local_e8) && ((pointer)local_168._0_8_ != (pointer)0x0)) {
      operator_delete__((void *)local_168._0_8_);
    }
    pcVar20 = std::
              _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:232:30)>
              ::_M_manager;
    local_168._8_8_ = 0;
    local_168._0_8_ = this;
    local_158._8_8_ =
         std::
         _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:232:30)>
         ::_M_invoke;
    local_158._0_8_ =
         std::
         _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:232:30)>
         ::_M_manager;
    InputGraph::for_each_edge
              (target,(function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_168);
    if ((code *)local_158._0_8_ != (code *)0x0) {
      (*(code *)local_158._0_8_)(local_168,local_168,3);
    }
  }
  bVar7 = InputGraph::has_vertex_labels(pattern);
  if (bVar7) {
    uVar11 = 0;
    if (this->target_size == 0) {
      sVar23 = 0;
    }
    else {
      do {
        local_168 = (undefined1  [16])InputGraph::vertex_label(target,uVar11);
        pVar28 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,int&>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                             *)&local_90,
                            (basic_string_view<char,_std::char_traits<char>_> *)local_168,&local_170
                           );
        if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_170 = local_170 + 1;
        }
        sVar23 = (size_type)this->target_size;
        uVar11 = uVar11 + 1;
      } while (uVar11 < this->target_size);
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
                ->target_vertex_labels,sVar23);
    if (this->target_size != 0) {
      uVar26 = 0;
      do {
        sVar29 = InputGraph::vertex_label(target,(int)uVar26);
        local_168._0_8_ = local_158;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,sVar29._M_str,sVar29._M_str + sVar29._M_len);
        iVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&local_90,(key_type *)local_168);
        pcVar20 = *(code **)&(((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                              ._M_head_impl)->target_vertex_labels).
                             super__Vector_base<int,_std::allocator<int>_>;
        *(_Rb_tree_color *)(pcVar20 + uVar26 * 4) = iVar15._M_node[2]._M_color;
        if ((undefined1 *)local_168._0_8_ != local_158) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 < this->target_size);
    }
  }
  bVar7 = InputGraph::has_edge_labels(pattern);
  if (bVar7) {
    std::vector<int,_std::allocator<int>_>::resize
              (&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
                ->target_edge_labels,(ulong)(this->target_size * this->target_size));
    local_168._8_8_ = 0;
    plVar16 = (long *)operator_new(0x18);
    *plVar16 = (long)&local_60;
    plVar16[1] = (long)&local_16c;
    pcVar20 = std::
              _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:255:30)>
              ::_M_manager;
    local_168._0_8_ = plVar16;
    plVar16[2] = (long)this;
    local_158._8_8_ =
         std::
         _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:255:30)>
         ::_M_invoke;
    local_158._0_8_ =
         std::
         _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:255:30)>
         ::_M_manager;
    InputGraph::for_each_edge
              (target,(function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_168);
    if ((code *)local_158._0_8_ != (code *)0x0) {
      (*(code *)local_158._0_8_)(local_168,local_168,3);
    }
  }
  _Var13._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  lVar14 = (long)(_Var13._M_head_impl)->params;
  plVar16 = *(long **)(lVar14 + 0x90);
  if (plVar16 != (long *)(lVar14 + 0x90)) {
    (_Var13._M_head_impl)->has_less_thans = true;
    local_d0 = 0;
    local_e0 = (long *******)&local_e0;
    local_d8 = (long *******)&local_e0;
    do {
      sVar29._M_str = (char *)pcVar20;
      sVar29._M_len = plVar16[2];
      iVar22 = HomomorphismModel::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)pattern,(InputGraph *)plVar16[3],sVar29);
      s._M_str = (char *)pcVar20;
      s._M_len = plVar16[6];
      iVar12 = HomomorphismModel::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)pattern,(InputGraph *)plVar16[7],s);
      p_Var17 = (_List_node_base *)operator_new(0x18);
      *(int *)&p_Var17[1]._M_next = iVar22;
      *(int *)((long)&p_Var17[1]._M_next + 4) = iVar12;
      std::__detail::_List_node_base::_M_hook(p_Var17);
      local_d0 = local_d0 + 1;
      plVar16 = (long *)*plVar16;
    } while (plVar16 != (long *)(lVar14 + 0x90));
    if ((long ********)local_e0 != &local_e0) {
      do {
        local_158._8_8_ = local_168 + 8;
        local_168._8_4_ = 0;
        local_158._0_8_ = (code *)0x0;
        local_158._24_8_ = 0;
        ppppppplVar25 = local_e0;
        local_158._16_8_ = local_158._8_8_;
        do {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_emplace_unique<unsigned_int&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)local_168,(uint *)((long)ppppppplVar25 + 0x14));
          ppppppplVar25 = (long *******)*ppppppplVar25;
        } while ((long ********)ppppppplVar25 != &local_e0);
        if ((long ********)local_e0 == &local_e0) {
LAB_0012c7a6:
          pUVar19 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Pattern less than constraints form a loop","");
          UnsupportedConfiguration::UnsupportedConfiguration(pUVar19,&local_c0);
          __cxa_throw(pUVar19,&UnsupportedConfiguration::typeinfo,
                      UnsupportedConfiguration::~UnsupportedConfiguration);
        }
        bVar7 = true;
        ppppppplVar25 = local_e0;
        do {
          while( true ) {
            ppVar3 = (pair<unsigned_int,_unsigned_int> *)(ppppppplVar25 + 2);
            sVar18 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_168,(key_type_conflict *)ppVar3);
            if (sVar18 == 0) break;
            ppppppplVar25 = (long *******)*ppppppplVar25;
            if ((long ********)ppppppplVar25 == &local_e0) {
              if (bVar7) goto LAB_0012c7a6;
              goto LAB_0012c415;
            }
          }
          iVar4._M_current =
               (this->pattern_less_thans_in_convenient_order).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->pattern_less_thans_in_convenient_order).
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
            ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>const&>(local_98,iVar4,ppVar3);
          }
          else {
            *iVar4._M_current = *ppVar3;
            pppVar1 = &(this->pattern_less_thans_in_convenient_order).
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          ppppppplVar5 = (long *******)*ppppppplVar25;
          local_d0 = local_d0 + -1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(ppppppplVar25,0x18);
          bVar7 = false;
          ppppppplVar25 = ppppppplVar5;
        } while ((long ********)ppppppplVar5 != &local_e0);
LAB_0012c415:
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_168);
      } while ((long ********)local_e0 != &local_e0);
    }
    _Var13._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    lVar14 = (long)(_Var13._M_head_impl)->params;
  }
  plVar16 = *(long **)(lVar14 + 0xa8);
  if (plVar16 != (long *)(lVar14 + 0xa8)) {
    (_Var13._M_head_impl)->has_occur_less_thans = true;
    local_d0 = 0;
    pHVar21 = local_c8;
    local_e0 = (long *******)&local_e0;
    local_d8 = (long *******)&local_e0;
    do {
      s_00._M_str = (char *)pHVar21;
      s_00._M_len = plVar16[2];
      iVar22 = HomomorphismModel::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)target,(InputGraph *)plVar16[3],s_00);
      s_01._M_str = (char *)pHVar21;
      s_01._M_len = plVar16[6];
      iVar12 = HomomorphismModel::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)target,(InputGraph *)plVar16[7],s_01);
      p_Var17 = (_List_node_base *)operator_new(0x18);
      *(int *)&p_Var17[1]._M_next = iVar22;
      *(int *)((long)&p_Var17[1]._M_next + 4) = iVar12;
      std::__detail::_List_node_base::_M_hook(p_Var17);
      local_d0 = local_d0 + 1;
      plVar16 = (long *)*plVar16;
    } while (plVar16 != (long *)(lVar14 + 0xa8));
    if ((long ********)local_e0 != &local_e0) {
      do {
        local_158._8_8_ = local_168 + 8;
        local_168._8_4_ = 0;
        local_158._0_8_ = (code *)0x0;
        local_158._24_8_ = 0;
        ppppppplVar25 = local_e0;
        local_158._16_8_ = local_158._8_8_;
        do {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_emplace_unique<unsigned_int&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)local_168,(uint *)((long)ppppppplVar25 + 0x14));
          ppppppplVar25 = (long *******)*ppppppplVar25;
        } while ((long ********)ppppppplVar25 != &local_e0);
        if ((long ********)local_e0 == &local_e0) {
LAB_0012c805:
          pUVar19 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Target less than constraints form a loop","");
          UnsupportedConfiguration::UnsupportedConfiguration(pUVar19,&local_c0);
          __cxa_throw(pUVar19,&UnsupportedConfiguration::typeinfo,
                      UnsupportedConfiguration::~UnsupportedConfiguration);
        }
        bVar7 = true;
        ppppppplVar25 = local_e0;
        do {
          while( true ) {
            ppVar3 = (pair<unsigned_int,_unsigned_int> *)(ppppppplVar25 + 2);
            sVar18 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_168,(key_type_conflict *)ppVar3);
            if (sVar18 == 0) break;
            ppppppplVar25 = (long *******)*ppppppplVar25;
            if ((long ********)ppppppplVar25 == &local_e0) {
              if (bVar7) goto LAB_0012c805;
              goto LAB_0012c5b0;
            }
          }
          iVar4._M_current =
               (this->target_occur_less_thans_in_convenient_order).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->target_occur_less_thans_in_convenient_order).
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
            ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>const&>(local_a0,iVar4,ppVar3);
          }
          else {
            *iVar4._M_current = *ppVar3;
            pppVar1 = &(this->target_occur_less_thans_in_convenient_order).
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          ppppppplVar5 = (long *******)*ppppppplVar25;
          local_d0 = local_d0 + -1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(ppppppplVar25,0x18);
          bVar7 = false;
          ppppppplVar25 = ppppppplVar5;
        } while ((long ********)ppppppplVar5 != &local_e0);
LAB_0012c5b0:
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_168);
      } while ((long ********)local_e0 != &local_e0);
    }
  }
  if (local_c8->clique_size_constraints == true) {
    _Var13._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    uVar11 = 0;
    if ((_Var13._M_head_impl)->max_graphs_for_clique_size_constraints == 0) {
      sVar23 = 0;
    }
    else {
      do {
        iVar22 = InputGraph::size(pattern);
        local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffff00000000;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_168,(long)iVar22,
                   (value_type_conflict1 *)&local_c0,(allocator_type *)&local_e0);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var13._M_head_impl)->pattern_cliques_sizes,
                   (vector<int,_std::allocator<int>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_168._0_8_,local_158._0_8_ - local_168._0_8_);
        }
        _Var13._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        iVar22 = InputGraph::size(target);
        local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffff00000000;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_168,(long)iVar22,
                   (value_type_conflict1 *)&local_c0,(allocator_type *)&local_e0);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var13._M_head_impl)->target_cliques_sizes,
                   (vector<int,_std::allocator<int>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_168._0_8_,local_158._0_8_ - local_168._0_8_);
        }
        _Var13._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        iVar22 = InputGraph::size(pattern);
        local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffff00000000;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_168,(long)iVar22,
                   (value_type_conflict1 *)&local_c0,(allocator_type *)&local_e0);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var13._M_head_impl)->pattern_cliques_best_knowns,
                   (vector<int,_std::allocator<int>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_168._0_8_,local_158._0_8_ - local_168._0_8_);
        }
        _Var13._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        iVar22 = InputGraph::size(target);
        local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffff00000000;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_168,(long)iVar22,
                   (value_type_conflict1 *)&local_c0,(allocator_type *)&local_e0);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var13._M_head_impl)->target_cliques_best_knowns,
                   (vector<int,_std::allocator<int>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_168._0_8_,local_158._0_8_ - local_168._0_8_);
        }
        _Var13._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        uVar11 = uVar11 + 1;
        sVar23 = (size_type)(_Var13._M_head_impl)->max_graphs_for_clique_size_constraints;
      } while (uVar11 < (_Var13._M_head_impl)->max_graphs_for_clique_size_constraints);
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&(_Var13._M_head_impl)->largest_pattern_clique,sVar23);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

HomomorphismModel::HomomorphismModel(const InputGraph & target, const InputGraph & pattern, const HomomorphismParams & params,
    const std::shared_ptr<Proof> & proof) :
    _imp(new Imp(params, proof)),
    max_graphs(calculate_n_shape_graphs(params)),
    pattern_size(pattern.size()),
    target_size(target.size())
{
    if (_imp->params.clique_size_constraints)
        _imp->max_graphs_for_clique_size_constraints = (_imp->params.clique_size_constraints_on_supplementals ? max_graphs : 1);

    _imp->patterns_degrees.resize(max_graphs);
    _imp->targets_degrees.resize(max_graphs);

    if (max_graphs > 8 * sizeof(PatternAdjacencyBitsType))
        throw UnsupportedConfiguration{"Supplemental graphs won't fit in the chosen bitset size"};

    if (_imp->proof) {
        for (int v = 0; v < pattern.size(); ++v)
            _imp->pattern_vertex_proof_names.push_back(pattern.vertex_name(v));
        for (int v = 0; v < target.size(); ++v)
            _imp->target_vertex_proof_names.push_back(target.vertex_name(v));
    }

    if (pattern.directed())
        _imp->directed = true;

    // recode pattern to a bit graph, and strip out loops
    _imp->pattern_graph_rows.resize(pattern_size * max_graphs, SVOBitset(pattern_size, 0));
    _imp->pattern_loops.resize(pattern_size);
    for (unsigned i = 0; i < pattern_size; ++i) {
        for (unsigned j = 0; j < pattern_size; ++j) {
            if (pattern.adjacent(i, j)) {
                if (i == j)
                    _imp->pattern_loops[i] = 1;
                else
                    _imp->pattern_graph_rows[i * max_graphs + 0].set(j);
            }
        }
    }

    // re-encode and store pattern labels
    map<string, int> vertex_labels_map;
    int next_vertex_label = 1;
    if (pattern.has_vertex_labels()) {
        for (unsigned i = 0; i < pattern_size; ++i) {
            if (vertex_labels_map.emplace(pattern.vertex_label(i), next_vertex_label).second)
                ++next_vertex_label;
        }

        _imp->pattern_vertex_labels.resize(pattern_size);
        for (unsigned i = 0; i < pattern_size; ++i)
            _imp->pattern_vertex_labels[i] = vertex_labels_map.find(string{pattern.vertex_label(i)})->second;
    }

    // re-encode and store edge labels
    map<string, int> edge_labels_map;
    int next_edge_label = 1;
    if (pattern.has_edge_labels()) {
        _imp->pattern_edge_labels.resize(pattern_size * pattern_size);
        for (unsigned i = 0; i < pattern_size; ++i)
            for (unsigned j = 0; j < pattern_size; ++j)
                if (pattern.adjacent(i, j)) {
                    auto r = edge_labels_map.emplace(pattern.edge_label(i, j), next_edge_label);
                    if (r.second)
                        ++next_edge_label;
                    _imp->pattern_edge_labels[i * pattern_size + j] = r.first->second;
                }
    }

    // recode target to a bit graph, and take out loops
    _imp->target_graph_rows.resize(target_size * max_graphs, SVOBitset{target_size, 0});
    _imp->target_loops.resize(target_size);
    target.for_each_edge([&](int f, int t, string_view) {
        if (f == t)
            _imp->target_loops[f] = 1;
        else
            _imp->target_graph_rows[f * max_graphs + 0].set(t);
    });

    // if directed, do both directions
    if (pattern.directed()) {
        _imp->forward_target_graph_rows.resize(target_size, SVOBitset{target_size, 0});
        _imp->reverse_target_graph_rows.resize(target_size, SVOBitset{target_size, 0});
        target.for_each_edge([&](int f, int t, string_view l) {
            if (f != t && l != "unlabelled") {
                _imp->forward_target_graph_rows[f].set(t);
                _imp->reverse_target_graph_rows[t].set(f);
            }
        });
    }

    // target vertex labels
    if (pattern.has_vertex_labels()) {
        for (unsigned i = 0; i < target_size; ++i) {
            if (vertex_labels_map.emplace(target.vertex_label(i), next_vertex_label).second)
                ++next_vertex_label;
        }

        _imp->target_vertex_labels.resize(target_size);
        for (unsigned i = 0; i < target_size; ++i)
            _imp->target_vertex_labels[i] = vertex_labels_map.find(string{target.vertex_label(i)})->second;
    }

    // target edge labels
    if (pattern.has_edge_labels()) {
        _imp->target_edge_labels.resize(target_size * target_size);
        target.for_each_edge([&](int f, int t, string_view l) {
            auto r = edge_labels_map.emplace(l, next_edge_label);
            if (r.second)
                ++next_edge_label;

            _imp->target_edge_labels[f * target_size + t] = r.first->second;
        });
    }

    auto decode = [&](const InputGraph & g, string_view s) -> int {
        auto n = g.vertex_from_name(s);
        if (! n)
            throw UnsupportedConfiguration{"No vertex named '" + string{s} + "'"};
        return *n;
    };

    // pattern less than constraints
    if (! _imp->params.pattern_less_constraints.empty()) {
        _imp->has_less_thans = true;
        list<pair<unsigned, unsigned>> pattern_less_thans_in_wrong_order;
        for (auto & [a, b] : _imp->params.pattern_less_constraints) {
            auto a_decoded = decode(pattern, a), b_decoded = decode(pattern, b);
            pattern_less_thans_in_wrong_order.emplace_back(a_decoded, b_decoded);
        }

        // put them in a convenient order, so we don't need a propagation loop
        while (! pattern_less_thans_in_wrong_order.empty()) {
            bool loop_detect = true;
            set<unsigned> cannot_order_yet;
            for (auto & [_, b] : pattern_less_thans_in_wrong_order)
                cannot_order_yet.emplace(b);
            for (auto p = pattern_less_thans_in_wrong_order.begin(); p != pattern_less_thans_in_wrong_order.end();) {
                if (cannot_order_yet.count(p->first))
                    ++p;
                else {
                    loop_detect = false;
                    pattern_less_thans_in_convenient_order.push_back(*p);
                    pattern_less_thans_in_wrong_order.erase(p++);
                }
            }

            if (loop_detect)
                throw UnsupportedConfiguration{"Pattern less than constraints form a loop"};
        }
    }

    // target less than constraints
    if (! _imp->params.target_occur_less_constraints.empty()) {
        _imp->has_occur_less_thans = true;
        list<pair<unsigned, unsigned>> target_occur_less_thans_in_wrong_order;
        for (auto & [a, b] : _imp->params.target_occur_less_constraints) {
            auto a_decoded = decode(target, a), b_decoded = decode(target, b);
            target_occur_less_thans_in_wrong_order.emplace_back(a_decoded, b_decoded);
        }

        // put them in a convenient order, so we don't need a propagation loop
        while (! target_occur_less_thans_in_wrong_order.empty()) {
            bool loop_detect = true;
            set<unsigned> cannot_order_yet;
            for (auto & [_, b] : target_occur_less_thans_in_wrong_order)
                cannot_order_yet.emplace(b);
            for (auto t = target_occur_less_thans_in_wrong_order.begin(); t != target_occur_less_thans_in_wrong_order.end();) {
                if (cannot_order_yet.count(t->first))
                    ++t;
                else {
                    loop_detect = false;
                    target_occur_less_thans_in_convenient_order.push_back(*t);
                    target_occur_less_thans_in_wrong_order.erase(t++);
                }
            }

            if (loop_detect)
                throw UnsupportedConfiguration{"Target less than constraints form a loop"};
        }
    }

    // make space for clique constraints
    if (params.clique_size_constraints) {
        for (unsigned g = 0; g < _imp->max_graphs_for_clique_size_constraints; ++g) {
            _imp->pattern_cliques_sizes.push_back(vector<int>(pattern.size(), 0));
            _imp->target_cliques_sizes.push_back(vector<int>(target.size(), 0));
            _imp->pattern_cliques_best_knowns.push_back(vector<int>(pattern.size(), 0));
            _imp->target_cliques_best_knowns.push_back(vector<int>(target.size(), 0));
        }
        _imp->largest_pattern_clique.resize(_imp->max_graphs_for_clique_size_constraints);
    }
}